

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O0

void __thiscall SQCompilation::CommaExpr::addExpression(CommaExpr *this,Expr *expr)

{
  bool bVar1;
  int iVar2;
  Node *in_RSI;
  Node *in_RDI;
  
  bVar1 = ArenaVector<SQCompilation::Expr_*>::empty
                    ((ArenaVector<SQCompilation::Expr_*> *)(in_RDI + 1));
  if (bVar1) {
    iVar2 = Node::lineStart(in_RSI);
    Node::setLineStartPos(in_RDI,iVar2);
    iVar2 = Node::columnStart(in_RSI);
    Node::setColumnStartPos(in_RDI,iVar2);
  }
  else {
    iVar2 = Node::lineEnd(in_RSI);
    Node::setLineEndPos(in_RDI,iVar2);
    iVar2 = Node::columnEnd(in_RSI);
    Node::setColumnEndPos(in_RDI,iVar2);
  }
  ArenaVector<SQCompilation::Expr_*>::push_back
            ((ArenaVector<SQCompilation::Expr_*> *)in_RSI,(Expr **)in_RDI);
  return;
}

Assistant:

void addExpression(Expr *expr) {
      if (_exprs.empty()) {
        setLineStartPos(expr->lineStart());
        setColumnStartPos(expr->columnStart());
      }
      else {
        setLineEndPos(expr->lineEnd());
        setColumnEndPos(expr->columnEnd());
      }

      _exprs.push_back(expr);
    }